

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void bfgs_iter_middle<sparse_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               sparse_parameters *weights)

{
  float fVar1;
  double dVar2;
  sparse_parameters *psVar3;
  bool bVar4;
  uint32_t uVar5;
  char *pcVar6;
  float *pfVar7;
  undefined8 uVar8;
  double *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  sparse_parameters *in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *p_Var9;
  long in_RDI;
  double *in_R8;
  int *in_R9;
  float fVar10;
  float fVar11;
  iterator iVar12;
  int *in_stack_00000008;
  sparse_parameters *in_stack_00000010;
  int j_2;
  iterator w_7;
  iterator w_6;
  iterator w_5;
  int j_1;
  double coef_j;
  iterator w_4;
  double y_r;
  iterator w_3;
  int j;
  float gamma;
  float *mem1;
  iterator w_2;
  double s_q;
  double y_Hy;
  double y_s;
  iterator w_1;
  float beta;
  iterator w;
  double y;
  double g_Hg;
  double g_Hy;
  uint32_t length;
  float *mem0;
  sparse_iterator<float> *in_stack_fffffffffffffb98;
  sparse_parameters *in_stack_fffffffffffffba0;
  int local_43c;
  int local_2a4;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_290;
  uint32_t local_288;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_280;
  uint32_t local_278;
  sparse_iterator<float> local_270;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_260;
  uint32_t local_258;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_250;
  uint32_t local_248;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_240;
  uint32_t local_238;
  sparse_iterator<float> local_230;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_220;
  uint32_t local_218;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_210;
  uint32_t local_208;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_200;
  uint32_t local_1f8;
  sparse_iterator<float> local_1f0;
  int local_1dc;
  double local_1d8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_1d0;
  uint32_t local_1c8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_1c0;
  uint32_t local_1b8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_1b0;
  uint32_t local_1a8;
  sparse_iterator<float> local_1a0;
  double local_190;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_188;
  uint32_t local_180;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_178;
  uint32_t local_170;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_168;
  uint32_t local_160;
  sparse_iterator<float> local_158;
  int local_148;
  float local_144;
  long local_140;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_138;
  uint32_t local_130;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_128;
  uint32_t local_120;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_118;
  uint32_t local_110;
  sparse_iterator<float> local_108;
  double local_f8;
  double local_f0;
  double local_e8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_e0;
  uint32_t local_d8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_d0;
  uint32_t local_c8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_c0;
  uint32_t local_b8;
  sparse_iterator<float> local_b0;
  float local_9c;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_98;
  uint32_t local_90;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_88;
  uint32_t local_80;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_78;
  uint32_t local_70;
  sparse_iterator<float> local_68;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  sparse_parameters *local_38;
  int *local_30;
  double *local_28;
  double *local_20;
  sparse_parameters *local_18;
  long local_10;
  long local_8;
  
  local_3c = 1 << ((byte)*(undefined4 *)(in_RDI + 0x50) & 0x1f);
  local_38 = in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(int *)(in_RSI + 8) == 0) {
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_8 = in_RDI;
    iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
    local_78._M_cur =
         (__node_type *)
         iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_70 = iVar12._stride;
    local_68._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_78._M_cur;
    local_68._stride = local_70;
    while( true ) {
      iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
      local_98._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_90 = iVar12._stride;
      p_Var9 = &local_88;
      local_88._M_cur = local_98._M_cur;
      local_80 = local_90;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98);
      psVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = sparse_iterator<float>::index(&local_68,(char *)p_Var9,__c);
      uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
      local_18 = (sparse_parameters *)
                 ((long)&(psVar3->_map)._M_h._M_buckets +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241ad3);
      local_58 = (double)(pfVar7[1] -
                         *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                                   (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4));
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241b2e);
      fVar1 = pfVar7[1];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241b4d);
      local_48 = (double)fVar1 * (double)pfVar7[3] * local_58 + local_48;
      fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                        (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241bdc);
      local_50 = (double)fVar1 * (double)pfVar7[3] *
                 (double)*(float *)((long)&(local_18->_map)._M_h._M_buckets +
                                   (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) +
                 local_50;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
    }
    local_9c = (float)(local_48 / local_50);
    if ((local_9c < 0.0) || (bVar4 = nanpattern(0.0), bVar4)) {
      local_9c = 0.0;
    }
    iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
    local_c0._M_cur =
         (__node_type *)
         iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_b8 = iVar12._stride;
    local_b0._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_c0._M_cur;
    local_b0._stride = local_b8;
    while( true ) {
      iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
      local_e0._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_d8 = iVar12._stride;
      p_Var9 = &local_d0;
      local_d0._M_cur = local_e0._M_cur;
      local_c8 = local_d8;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98);
      psVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = sparse_iterator<float>::index(&local_b0,(char *)p_Var9,__c_00);
      uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
      local_18 = (sparse_parameters *)
                 ((long)&(psVar3->_map)._M_h._M_buckets +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241db7);
      fVar1 = local_9c;
      *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) = pfVar7[1];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241e17);
      pfVar7[2] = fVar1 * pfVar7[2];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241e37);
      fVar1 = pfVar7[3];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241e52);
      fVar10 = pfVar7[1];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241e6d);
      pfVar7[2] = -fVar1 * fVar10 + pfVar7[2];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x241eac);
      pfVar7[1] = 0.0;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
    }
    if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
      fprintf(_stderr,"%f\t",(double)local_9c);
    }
  }
  else {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    if ((*(byte *)(in_RDI + 0x3439) & 1) == 0) {
      fprintf(_stderr,"%-10s\t","");
    }
    local_e8 = 0.0;
    local_f0 = 0.0;
    local_f8 = 0.0;
    iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
    local_118._M_cur =
         (__node_type *)
         iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_110 = iVar12._stride;
    local_108._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_118._M_cur;
    local_108._stride = local_110;
    while( true ) {
      iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
      local_138._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_130 = iVar12._stride;
      p_Var9 = &local_128;
      local_128._M_cur = local_138._M_cur;
      local_120 = local_130;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98);
      psVar3 = local_18;
      if (!bVar4) break;
      pcVar6 = sparse_iterator<float>::index(&local_108,(char *)p_Var9,__c_01);
      uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
      local_140 = (long)&(psVar3->_map)._M_h._M_buckets +
                  ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4;
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242064);
      *(float *)(local_140 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) =
           pfVar7[1] -
           *(float *)(local_140 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2420ee);
      *(float *)(local_140 + (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4) =
           *pfVar7 - *(float *)(local_140 +
                               (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242177);
      fVar1 = pfVar7[1];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242192);
      pfVar7[2] = fVar1;
      local_e8 = (double)*(float *)(local_140 +
                                   (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) *
                 (double)*(float *)(local_140 +
                                   (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4)
                 + local_e8;
      fVar1 = *(float *)(local_140 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      fVar10 = *(float *)(local_140 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2422d4);
      local_f0 = (double)fVar1 * (double)fVar10 * (double)pfVar7[3] + local_f0;
      fVar1 = *(float *)(local_140 +
                        (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242356);
      local_f8 = (double)fVar1 * (double)pfVar7[1] + local_f8;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
    }
    if ((local_e8 <= 0.0) || (local_f0 <= 0.0)) {
      uVar8 = __cxa_allocate_exception(8);
      curv_exception::curv_exception
                ((curv_exception *)in_stack_fffffffffffffba0,
                 (curv_exception *)in_stack_fffffffffffffb98);
      __cxa_throw(uVar8,&curv_exception::typeinfo,curv_exception::~curv_exception);
    }
    *local_20 = 1.0 / local_e8;
    local_144 = (float)(local_e8 / local_f0);
    for (local_148 = 0; local_148 < *local_30; local_148 = local_148 + 1) {
      local_28[local_148] = local_20[local_148] * local_f8;
      local_f8 = 0.0;
      iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
      local_168._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_160 = iVar12._stride;
      local_158._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_168._M_cur
      ;
      local_158._stride = local_160;
      while( true ) {
        iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
        local_188._M_cur =
             (__node_type *)
             iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
             _M_cur;
        local_180 = iVar12._stride;
        p_Var9 = &local_178;
        local_178._M_cur = local_188._M_cur;
        local_170 = local_180;
        bVar4 = sparse_iterator<float>::operator!=
                          ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                           in_stack_fffffffffffffb98);
        psVar3 = local_38;
        if (!bVar4) break;
        pcVar6 = sparse_iterator<float>::index(&local_158,(char *)p_Var9,__c_02);
        uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
        local_18 = (sparse_parameters *)
                   ((long)&(psVar3->_map)._M_h._M_buckets +
                   ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
        dVar2 = local_28[local_148];
        fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                          (long)((local_148 * 2 + *in_stack_00000008) % *(int *)(local_10 + 0xb4)) *
                          4);
        pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242602);
        pfVar7[2] = -(float)dVar2 * fVar1 + pfVar7[2];
        fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                          (long)((local_148 * 2 + 3 + *in_stack_00000008) %
                                *(int *)(local_10 + 0xb4)) * 4);
        pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242696);
        local_f8 = (double)fVar1 * (double)pfVar7[2] + local_f8;
        sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
      }
    }
    local_28[*local_30] = local_20[*local_30] * local_f8;
    local_190 = 0.0;
    iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
    local_1b0._M_cur =
         (__node_type *)
         iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_1a8 = iVar12._stride;
    local_1a0._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_1b0._M_cur;
    local_1a0._stride = local_1a8;
    while( true ) {
      iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
      local_1d0._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_1c8 = iVar12._stride;
      p_Var9 = &local_1c0;
      local_1c0._M_cur = local_1d0._M_cur;
      local_1b8 = local_1c8;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98);
      psVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = sparse_iterator<float>::index(&local_1a0,(char *)p_Var9,__c_03);
      uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
      local_18 = (sparse_parameters *)
                 ((long)&(psVar3->_map)._M_h._M_buckets +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      dVar2 = local_28[*local_30];
      fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                        (long)((*local_30 * 2 + *in_stack_00000008) % *(int *)(local_10 + 0xb4)) * 4
                        );
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2428ad);
      fVar10 = local_144;
      pfVar7[2] = -(float)dVar2 * fVar1 + pfVar7[2];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x2428fe);
      fVar1 = pfVar7[3];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242922);
      pfVar7[2] = fVar10 * fVar1 * pfVar7[2];
      fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                        (long)((*local_30 * 2 + *in_stack_00000008) % *(int *)(local_10 + 0xb4)) * 4
                        );
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242997);
      local_190 = (double)fVar1 * (double)pfVar7[2] + local_190;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
    }
    for (local_1dc = *local_30; 0 < local_1dc; local_1dc = local_1dc + -1) {
      local_1d8 = local_28[local_1dc] - local_20[local_1dc] * local_190;
      local_190 = 0.0;
      iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
      local_200._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_1f8 = iVar12._stride;
      local_1f0._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_200._M_cur
      ;
      local_1f0._stride = local_1f8;
      while( true ) {
        iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
        local_220._M_cur =
             (__node_type *)
             iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
             _M_cur;
        local_218 = iVar12._stride;
        p_Var9 = &local_210;
        local_210._M_cur = local_220._M_cur;
        local_208 = local_218;
        bVar4 = sparse_iterator<float>::operator!=
                          ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                           in_stack_fffffffffffffb98);
        psVar3 = local_38;
        if (!bVar4) break;
        pcVar6 = sparse_iterator<float>::index(&local_1f0,(char *)p_Var9,__c_04);
        uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
        local_18 = (sparse_parameters *)
                   ((long)&(psVar3->_map)._M_h._M_buckets +
                   ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
        fVar10 = (float)local_1d8;
        fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                          (long)((local_1dc * 2 + 1 + *in_stack_00000008) %
                                *(int *)(local_10 + 0xb4)) * 4);
        pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242b95);
        pfVar7[2] = fVar10 * fVar1 + pfVar7[2];
        fVar1 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                          (long)((local_1dc * 2 + -2 + *in_stack_00000008) %
                                *(int *)(local_10 + 0xb4)) * 4);
        pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242c0c);
        local_190 = (double)fVar1 * (double)pfVar7[2] + local_190;
        sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
      }
    }
    local_1d8 = *local_28 - *local_20 * local_190;
    iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
    local_240._M_cur =
         (__node_type *)
         iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_238 = iVar12._stride;
    local_230._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_240._M_cur;
    local_230._stride = local_238;
    while( true ) {
      iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
      local_260._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_258 = iVar12._stride;
      p_Var9 = &local_250;
      local_250._M_cur = local_260._M_cur;
      local_248 = local_258;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98);
      psVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = sparse_iterator<float>::index(&local_230,(char *)p_Var9,__c_05);
      uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
      local_18 = (sparse_parameters *)
                 ((long)&(psVar3->_map)._M_h._M_buckets +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242d92);
      fVar1 = pfVar7[2];
      fVar11 = (float)local_1d8;
      fVar10 = *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                         (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242e0f);
      pfVar7[2] = -fVar11 * fVar10 + -fVar1;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
    }
    if (*local_30 < *(int *)(local_10 + 8) + -1) {
      local_43c = *local_30 + 1;
    }
    else {
      local_43c = *(int *)(local_10 + 8) + -1;
    }
    *local_30 = local_43c;
    *in_stack_00000008 =
         (*in_stack_00000008 + -2 + *(int *)(local_10 + 0xb4)) % *(int *)(local_10 + 0xb4);
    iVar12 = sparse_parameters::begin(in_stack_fffffffffffffba0);
    local_280._M_cur =
         (__node_type *)
         iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_278 = iVar12._stride;
    local_270._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_280._M_cur;
    local_270._stride = local_278;
    while( true ) {
      iVar12 = sparse_parameters::end(in_stack_fffffffffffffba0);
      local_290._M_cur =
           (__node_type *)
           iVar12._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_288 = iVar12._stride;
      p_Var9 = &local_290;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb98);
      if (!bVar4) break;
      in_stack_fffffffffffffba0 = local_38;
      in_stack_fffffffffffffb98 =
           (sparse_iterator<float> *)sparse_iterator<float>::index(&local_270,(char *)p_Var9,__c_06)
      ;
      uVar5 = sparse_parameters::stride_shift(in_stack_00000010);
      local_18 = (sparse_parameters *)
                 ((long)&(in_stack_fffffffffffffba0->_map)._M_h._M_buckets +
                 ((ulong)in_stack_fffffffffffffb98 >> ((byte)uVar5 & 0x3f)) *
                 (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242fa9);
      *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) = pfVar7[1];
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x242ff1);
      *(float *)((long)&(local_18->_map)._M_h._M_buckets +
                (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4) = *pfVar7;
      pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x243038);
      pfVar7[1] = 0.0;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffba0);
    }
    for (local_2a4 = *local_30; 0 < local_2a4; local_2a4 = local_2a4 + -1) {
      local_20[local_2a4] = local_20[local_2a4 + -1];
    }
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}